

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

void __thiscall RangeLock_TryLockSucceeds_Test::TestBody(RangeLock_TryLockSucceeds_Test *this)

{
  bool bVar1;
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_00;
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_01;
  MockSpec<void_(unsigned_long,_unsigned_long)> *this_02;
  TypedExpectation<void_(unsigned_long,_unsigned_long)> *this_03;
  char *pcVar2;
  Matcher<pstore::file::file_base::blocking_mode> *gmock_a3;
  string local_5f0;
  AssertHelper local_5d0;
  Message local_5c8;
  bool local_5b9;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_588;
  Message local_580;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_;
  undefined1 local_560 [7];
  bool locked;
  range_lock lock;
  Matcher<unsigned_long> local_538;
  Matcher<unsigned_long> local_520;
  MockSpec<void_(unsigned_long,_unsigned_long)> local_508;
  ReturnAction<bool> local_4d0;
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_4c0;
  WithoutMatchers local_499;
  Matcher<pstore::file::file_base::blocking_mode> local_498;
  Matcher<pstore::file::file_base::lock_kind> local_480;
  Matcher<unsigned_long> local_468;
  Matcher<unsigned_long> local_440;
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  local_428;
  undefined1 local_3c0 [8];
  mock_file file;
  RangeLock_TryLockSucceeds_Test *this_local;
  
  file.gmock02_unlock_96.super_UntypedFunctionMockerBase.untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16883::mock_file::mock_file((mock_file *)local_3c0);
  testing::Matcher<unsigned_long>::Matcher(&local_440,5);
  testing::Matcher<unsigned_long>::Matcher(&local_468,7);
  testing::Matcher<pstore::file::file_base::lock_kind>::Matcher(&local_480,exclusive_write);
  testing::Matcher<pstore::file::file_base::blocking_mode>::Matcher(&local_498,non_blocking);
  gmock_a3 = &local_498;
  anon_unknown.dwarf_16883::mock_file::gmock_lock
            (&local_428,(mock_file *)local_3c0,&local_440,&local_468,&local_480,gmock_a3);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::operator()(&local_428,&local_499,(void *)0x0);
  this_01 = testing::internal::
            MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                       ,0x10f,"file",
                       "lock (5UL, std::size_t{7}, mock_file::lock_kind::exclusive_write, mock_file::blocking_mode::non_blocking)"
                      );
  testing::Return<bool>((testing *)&local_4d0,true);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_4c0,(ReturnAction *)&local_4d0);
  testing::internal::
  TypedExpectation<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::WillOnce(this_01,&local_4c0);
  testing::
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~Action(&local_4c0);
  testing::internal::ReturnAction<bool>::~ReturnAction(&local_4d0);
  testing::internal::
  MockSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  ::~MockSpec(&local_428);
  testing::Matcher<pstore::file::file_base::blocking_mode>::~Matcher(&local_498);
  testing::Matcher<pstore::file::file_base::lock_kind>::~Matcher(&local_480);
  testing::Matcher<unsigned_long>::~Matcher(&local_468);
  testing::Matcher<unsigned_long>::~Matcher(&local_440);
  testing::Matcher<unsigned_long>::Matcher(&local_520,5);
  testing::Matcher<unsigned_long>::Matcher(&local_538,7);
  anon_unknown.dwarf_16883::mock_file::gmock_unlock
            (&local_508,(mock_file *)local_3c0,&local_520,&local_538);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::operator()
                      (&local_508,(WithoutMatchers *)&lock.field_0x1f,(void *)0x0);
  this_03 = testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                       ,0x111,"file","unlock (5UL, std::size_t{7})");
  testing::internal::TypedExpectation<void_(unsigned_long,_unsigned_long)>::Times(this_03,1);
  testing::internal::MockSpec<void_(unsigned_long,_unsigned_long)>::~MockSpec(&local_508);
  testing::Matcher<unsigned_long>::~Matcher(&local_538);
  testing::Matcher<unsigned_long>::~Matcher(&local_520);
  pstore::file::range_lock::range_lock
            ((range_lock *)local_560,(file_base *)local_3c0,5,7,exclusive_write);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._7_1_ = pstore::file::range_lock::try_lock((range_lock *)local_560);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_578,
             (bool *)((long)&gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_578,(AssertionResult *)0x225ee9,
               "false","true",(char *)gmock_a3);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  local_5b9 = pstore::file::range_lock::is_locked((range_lock *)local_560);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b8,&local_5b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5f0,(internal *)local_5b8,(AssertionResult *)0x225db3,"false","true",
               (char *)gmock_a3);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x119,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    std::__cxx11::string::~string((string *)&local_5f0);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  pstore::file::range_lock::unlock((range_lock *)local_560);
  pstore::file::range_lock::~range_lock((range_lock *)local_560);
  anon_unknown.dwarf_16883::mock_file::~mock_file((mock_file *)local_3c0);
  return;
}

Assistant:

TEST (RangeLock, TryLockSucceeds) {
    mock_file file;

    // Set up the test expectations.
    using ::testing::_;
    using ::testing::Return;
    EXPECT_CALL (file, lock (UINT64_C (5), std::size_t{7}, mock_file::lock_kind::exclusive_write,
                             mock_file::blocking_mode::non_blocking))
        .WillOnce (Return (true));
    EXPECT_CALL (file, unlock (UINT64_C (5), std::size_t{7})).Times (1);

    pstore::file::range_lock lock (&file,
                                   UINT64_C (5),   // offset
                                   std::size_t{7}, // size
                                   mock_file::lock_kind::exclusive_write);
    bool locked = lock.try_lock ();
    EXPECT_TRUE (locked);
    EXPECT_TRUE (lock.is_locked ());
    lock.unlock ();
}